

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O1

int __thiscall
SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
::Decode(SketchImpl<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>_>
         *this,int max_count,uint64_t *out)

{
  uint uVar1;
  undefined4 uVar2;
  pointer pvVar3;
  bool bVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  Elem EVar8;
  iterator __begin0;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar9;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *pFVar10;
  uint *puVar11;
  undefined8 uVar12;
  long lVar13;
  Elem a;
  Elem extraout_EDX;
  Elem extraout_EDX_00;
  Elem a_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong uVar14;
  _Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
  *p_Var15;
  uint *puVar16;
  uint uVar17;
  long lVar18;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *__n;
  pointer pvVar19;
  pointer pvVar20;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *__src;
  pointer puVar21;
  ulong uVar22;
  long lVar23;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *__dest;
  undefined1 auVar24 [8];
  int iVar25;
  long in_FS_OFFSET;
  initializer_list<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> poly;
  vector<unsigned_int,_std::allocator<unsigned_int>_> all_syndromes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> current;
  vector<unsigned_int,_std::allocator<unsigned_int>_> roots;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *in_stack_fffffffffffffcc8;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *local_330;
  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
  *local_328;
  ulong local_320;
  uint local_310;
  Elem local_30c;
  long local_300;
  long local_2f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_2b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_278;
  undefined1 local_258 [8];
  uint *puStack_250;
  pointer local_248;
  uint auStack_218 [16];
  uint auStack_1d8 [16];
  uint auStack_198 [16];
  uint auStack_158 [16];
  uint auStack_118 [16];
  uint auStack_d8 [16];
  uint auStack_98 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_2b8,
             (long)(this->m_syndromes).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_syndromes).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 1);
  puVar21 = (this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(this->m_syndromes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar21;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 2;
    lVar18 = 0;
    do {
      local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar18 * 2] = puVar21[lVar18];
      uVar17 = local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar18];
      local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar18 * 2 + 1] =
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar17 >> 4 & 0xfc) + 0x100) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar17 & 0x3f) * 4) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar17 >> 10 & 0x7c) + 0x200) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar17 >> 0xf & 0x7c) + 0x280) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar17 >> 0x14 & 0x7c) + 0x300) ^
           *(uint *)((anonymous_namespace)::SQR_TABLE_32 + (ulong)(uVar17 >> 0x1b) * 4 + 0x380);
      lVar18 = lVar18 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar18);
  }
  local_278.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278,
             ((ulong)((long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) >> 1) + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_58,
             ((ulong)((long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) >> 1) + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_298,
             ((ulong)((long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) >> 1) + 1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278,1);
  *(undefined4 *)
   &((local_278.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_start = 1;
  __n = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
         *)0x1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_58,1);
  *local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  p_Var15 = (_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
             *)((long)local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2);
  if ((ulong)p_Var15 >> 0x36 == 0) {
    if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pFVar9 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                *)0x0;
      local_328 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                   *)0x0;
      uVar14 = 0;
    }
    else {
      pFVar9 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                *)std::
                  _Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                  ::_M_allocate(p_Var15,(size_t)__n);
      local_328 = pFVar9 + (long)p_Var15 * 0x200;
      uVar14 = extraout_RDX;
    }
    local_330 = pFVar9;
    if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_30c = 1;
      bVar7 = true;
      local_2f8 = -0x100;
      local_300 = 0xc;
      local_320 = 0;
      local_310 = 1;
      do {
        puVar21 = local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pFVar9 == local_328) {
          lVar13 = (long)pFVar9 - (long)local_330;
          if (lVar13 == 0x7ffffffffffffe00) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00b33ae1;
            std::__throw_length_error("vector::_M_realloc_insert");
            goto LAB_00b338f0;
          }
          uVar22 = lVar13 >> 9;
          uVar14 = uVar22;
          if (pFVar9 == local_330) {
            uVar14 = 1;
          }
          p_Var15 = (_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                     *)(uVar14 + uVar22);
          if ((_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
               *)0x3ffffffffffffe < p_Var15) {
            p_Var15 = (_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                       *)0x3fffffffffffff;
          }
          if (CARRY8(uVar14,uVar22)) {
            p_Var15 = (_Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                       *)0x3fffffffffffff;
          }
          pFVar10 = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                     *)std::
                       _Vector_base<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier,_std::allocator<(anonymous_namespace)::Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>::Multiplier>_>
                       ::_M_allocate(p_Var15,(size_t)__n);
          __n = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)(ulong)puVar21[local_320];
          anon_unknown.dwarf_418a755::
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          ::Multiplier::Multiplier((Multiplier *)(pFVar10 + lVar13),__n,a);
          __dest = pFVar10;
          uVar14 = extraout_RDX_01;
          for (__src = local_330; pFVar9 != __src; __src = __src + 0x200) {
            __n = __src;
            memcpy(__dest,__src,0x200);
            __dest = __dest + 0x200;
            uVar14 = extraout_RDX_02;
          }
          if (local_330 !=
              (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *)0x0) {
            __n = local_328 + -(long)local_330;
            operator_delete(local_330,(ulong)__n);
            uVar14 = extraout_RDX_03;
          }
          local_328 = pFVar10 + (long)p_Var15 * 0x200;
          local_330 = pFVar10;
        }
        else {
          __n = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)(ulong)local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[local_320];
          anon_unknown.dwarf_418a755::
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          ::Multiplier::Multiplier((Multiplier *)pFVar9,__n,(Elem)uVar14);
          uVar14 = extraout_RDX_00;
          __dest = pFVar9;
        }
        uVar17 = local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_320];
        lVar13 = (long)local_278.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_278.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar22 = lVar13 >> 2;
        if (1 < uVar22) {
          pFVar9 = local_330 + local_2f8;
          uVar14 = 1;
          do {
            uVar1 = *(uint *)((long)&((local_278.
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar14 * 4);
            __n = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                   *)(ulong)(uVar1 >> 0x1c);
            uVar17 = uVar17 ^ *(uint *)(pFVar9 + (ulong)(uVar1 & 0xf) * 4 + -0x100) ^
                     *(uint *)(pFVar9 + ((ulong)(uVar1 >> 2 & 0x3c) - 0xc0)) ^
                     *(uint *)(pFVar9 + ((ulong)(uVar1 >> 6 & 0x3c) - 0x80)) ^
                     *(uint *)(pFVar9 + ((ulong)(uVar1 >> 10 & 0x3c) - 0x40)) ^
                     *(uint *)(pFVar9 + (uVar1 >> 0xe & 0x3c)) ^
                     *(uint *)(pFVar9 + (ulong)(uVar1 >> 0x12 & 0x3c) + 0x40) ^
                     *(uint *)(pFVar9 + (ulong)(uVar1 >> 0x16 & 0x3c) + 0x80) ^
                     *(uint *)(pFVar9 + (long)__n * 4 + 0xc0);
            uVar14 = uVar14 + 1;
            pFVar9 = pFVar9 + -0x200;
          } while (uVar22 != uVar14);
        }
        EVar8 = (Elem)uVar14;
        bVar4 = true;
        if (uVar17 != 0) {
          lVar18 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          if (!bVar7) {
            local_30c = anon_unknown.dwarf_418a755::
                        Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                        ::Inv((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                               *)(ulong)local_310,(Elem)__n);
            bVar7 = true;
            EVar8 = extraout_EDX;
          }
          lVar18 = lVar18 >> 2;
          lVar23 = uVar22 + lVar18;
          uVar14 = (lVar13 >> 1) - 2;
          if (uVar14 <= local_320) {
            lVar13 = (long)(((int)local_320 - (int)lVar23) + 3);
            if ((ulong)(long)max_count < (lVar18 + lVar13) - 1U) {
              local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar4 = false;
              goto LAB_00b334f0;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (&local_298,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278)
            ;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_278,
                       ((long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) + lVar13);
            EVar8 = extraout_EDX_00;
          }
          EVar8 = anon_unknown.dwarf_418a755::
                  Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                  ::Mul((Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                         *)(ulong)uVar17,local_30c,EVar8);
          __n = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                 *)(ulong)EVar8;
          anon_unknown.dwarf_418a755::
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          ::Multiplier::Multiplier((Multiplier *)local_258,__n,a_00);
          puVar6 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
          puVar5 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar21 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          if ((long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start != 0) {
            lVar13 = (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2;
            __n = (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                   *)((long)&((local_278.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start +
                     ((local_300 + lVar23 * -4) * 0x40000000 >> 0x1e));
            lVar18 = 0;
            do {
              uVar1 = local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar18];
              *(uint *)(__n + lVar18 * 4) =
                   *(uint *)(__n + lVar18 * 4) ^
                   *(uint *)((long)auStack_218 + (ulong)(uVar1 >> 2 & 0x3c)) ^
                   *(uint *)(local_258 + (ulong)(uVar1 & 0xf) * 4) ^
                   *(uint *)((long)auStack_1d8 + (ulong)(uVar1 >> 6 & 0x3c)) ^
                   *(uint *)((long)auStack_198 + (ulong)(uVar1 >> 10 & 0x3c)) ^
                   *(uint *)((long)auStack_158 + (ulong)(uVar1 >> 0xe & 0x3c)) ^
                   *(uint *)((long)auStack_118 + (ulong)(uVar1 >> 0x12 & 0x3c)) ^
                   *(uint *)((long)auStack_d8 + (ulong)(uVar1 >> 0x16 & 0x3c)) ^
                   auStack_98[uVar1 >> 0x1c];
              lVar18 = lVar18 + 1;
            } while (lVar13 + (ulong)(lVar13 == 0) != lVar18);
          }
          if (uVar14 <= local_320) {
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = puVar21;
            local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = puVar5;
            local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = puVar6;
            bVar7 = false;
            local_310 = uVar17;
          }
          bVar4 = true;
        }
LAB_00b334f0:
        if (!bVar4) goto LAB_00b335a7;
        pFVar9 = __dest + 0x200;
        uVar14 = local_320 + 1;
        local_2f8 = local_2f8 + 0x200;
        local_300 = local_300 + 4;
        local_320 = uVar14;
      } while (uVar14 != (long)local_2b8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_2b8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2);
    }
    if ((local_278.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         local_278.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start) ||
       (*(int *)((long)&local_278.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 4) == 0)) {
      local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_278.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_278.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_278.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_278.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
LAB_00b335a7:
    if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_298.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_278.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_278.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_278.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_278.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_330 !=
        (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
         *)0x0) {
      operator_delete(local_330,(long)local_328 - (long)local_330);
    }
    lVar13 = (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2;
    iVar25 = -1;
    if (lVar13 != 0) {
      if (lVar13 == 1) {
        iVar25 = 0;
      }
      else if ((int)lVar13 <= max_count + 1) {
        pvVar19 = (pointer)((long)&(((pointer)
                                    ((long)local_2d8.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + -0x18))->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
        pvVar3 = (pointer)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        if (local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start < pvVar19 &&
            local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            pvVar20 = (pointer)((long)&(pvVar3->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 4);
            uVar2 = *(undefined4 *)
                     &(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            *(undefined4 *)
             &(pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start =
                 *(undefined4 *)
                  &(pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
            *(undefined4 *)
             &(pvVar19->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start = uVar2;
            pvVar19 = (pointer)((long)&pvVar19[-1].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
            pvVar3 = pvVar20;
          } while (pvVar20 < pvVar19);
        }
        EVar8 = this->m_basis;
        local_258 = (undefined1  [8])0x0;
        puStack_250 = (uint *)0x0;
        local_248 = (pointer)0x0;
        puVar16 = (uint *)0x0;
        if (local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          puVar21 = (pointer)0x0;
          auVar24 = (undefined1  [8])0x0;
        }
        else {
          puVar21 = (pointer)0x0;
          auVar24 = (undefined1  [8])0x0;
          if (EVar8 != 0) {
            if ((long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start == 4) {
              auVar24 = (undefined1  [8])0x0;
              puVar16 = (uint *)0x0;
              puVar21 = (pointer)0x0;
              local_258 = (undefined1  [8])0x0;
              puStack_250 = (uint *)0x0;
              local_248 = (pointer)0x0;
            }
            else {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258,lVar13 - 1
                        );
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58,&local_2d8)
              ;
              __l._M_len = 1;
              __l._M_array = &local_58;
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::vector(&local_278,__l,(allocator_type *)&local_298);
              if (local_58.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_58.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_58.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_58.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              bVar7 = RecFindRoots<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
                                (&local_278,0,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_258,
                                 false,0,EVar8,in_stack_fffffffffffffcc8);
              puVar21 = local_248;
              puVar16 = puStack_250;
              auVar24 = local_258;
              if ((bVar7) &&
                 (((long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 2) + -1 ==
                  (long)puStack_250 - (long)local_258 >> 2)) {
                local_258 = (undefined1  [8])0x0;
                puStack_250 = (uint *)0x0;
                local_248 = (pointer)0x0;
              }
              else {
                puVar16 = (uint *)0x0;
                puVar21 = (pointer)0x0;
                auVar24 = (undefined1  [8])0x0;
              }
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::~vector(&local_278);
            }
          }
        }
        if (local_258 != (undefined1  [8])0x0) {
          operator_delete((void *)local_258,(long)local_248 - (long)local_258);
        }
        if ((long)puVar16 - (long)auVar24 == 0) {
          iVar25 = -1;
        }
        else {
          iVar25 = (int)((ulong)((long)puVar16 - (long)auVar24) >> 2);
          puVar11 = (uint *)auVar24;
          do {
            *out = (ulong)*puVar11;
            out = out + 1;
            puVar11 = puVar11 + 1;
          } while (puVar11 != puVar16);
        }
        if (auVar24 != (undefined1  [8])0x0) {
          operator_delete((void *)auVar24,(long)puVar21 - (long)auVar24);
        }
      }
    }
    if ((pointer)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2d8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return iVar25;
    }
  }
  else {
LAB_00b338f0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      uVar12 = std::__throw_length_error("vector::reserve");
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_278);
      if (local_258 != (undefined1  [8])0x0) {
        operator_delete((void *)local_258,(long)local_248 - (long)local_258);
      }
      if ((pointer)local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        _Unwind_Resume(uVar12);
      }
    }
  }
LAB_00b33ae1:
  __stack_chk_fail();
}

Assistant:

int Decode(int max_count, uint64_t* out) const override
    {
        auto all_syndromes = ReconstructAllSyndromes(m_syndromes, m_field);
        auto poly = BerlekampMassey(all_syndromes, max_count, m_field);
        if (poly.size() == 0) return -1;
        if (poly.size() == 1) return 0;
        if ((int)poly.size() > 1 + max_count) return -1;
        std::reverse(poly.begin(), poly.end());
        auto roots = FindRoots(poly, m_basis, m_field);
        if (roots.size() == 0) return -1;

        for (const auto& root : roots) {
            *(out++) = m_field.ToUint64(root);
        }
        return static_cast<int>(roots.size());
    }